

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu.cxx
# Opt level: O2

int __thiscall menuwindow::early_hide_handle(menuwindow *this,int e)

{
  byte bVar1;
  int my;
  menustate *pmVar2;
  menustate *pmVar3;
  int iVar4;
  int iVar5;
  undefined8 in_RAX;
  Fl_Menu_Item *pFVar6;
  long lVar7;
  undefined8 uStack_38;
  int item;
  
  pmVar2 = ::p;
  my = Fl::e_y_root;
  iVar5 = Fl::e_x_root;
  switch(e) {
  case 1:
  case 3:
  case 5:
    goto switchD_001af617_caseD_1;
  case 2:
    if ((Fl::e_is_click != 0) && (::p->state != 1)) {
      if (::p->menubar == 0) {
        return 1;
      }
      if (::p->current_item == (Fl_Menu_Item *)0x0) {
        return 1;
      }
      if ((::p->current_item->flags & 0x60) != 0) {
        return 1;
      }
    }
    if (::p->current_item == (Fl_Menu_Item *)0x0) goto LAB_001af993;
    bVar1 = (byte)::p->current_item->flags & 0x11;
    goto joined_r0x001af878;
  default:
switchD_001af617_caseD_4:
    iVar5 = Fl_Window::handle((Fl_Window *)this,e);
    return iVar5;
  case 8:
    switch(Fl::e_keysym) {
    case 0xff51:
      iVar5 = ::p->menu_number;
      if (::p->menubar == 0) {
        if (iVar5 < 1) {
          return 1;
        }
      }
      else if (iVar5 < 2) {
        backward(0);
        return 1;
      }
      setitem(iVar5 - 1U,::p->p[iVar5 - 1U]->selected);
      return 1;
    case 0xff52:
      if (::p->menubar != 0 && ::p->menu_number == 0) {
        return 1;
      }
      iVar5 = backward(::p->menu_number);
      if (iVar5 != 0) {
        return 1;
      }
      if (pmVar2->menubar == 0) {
        return 1;
      }
      if (pmVar2->menu_number == 1) {
        setitem(0,pmVar2->p[0]->selected);
        return 1;
      }
      return 1;
    case 0xff53:
      iVar5 = ::p->menu_number;
      if (::p->menubar != 0) {
        if (iVar5 < 1) {
LAB_001af9cf:
          forward(0);
          return 1;
        }
        if (iVar5 == 1) {
          if (::p->nummenus == 2) goto LAB_001af9cf;
          iVar5 = 1;
        }
      }
      if (::p->nummenus + -1 <= iVar5) {
        return 1;
      }
      iVar5 = iVar5 + 1;
      goto LAB_001afa31;
    case 0xff54:
switchD_001af891_caseD_ff54:
      if ((::p->menu_number == 0) && (::p->menubar != 0)) {
        if (::p->nummenus < 2) {
          return 1;
        }
        iVar5 = 1;
      }
      else {
        iVar5 = forward(::p->menu_number);
        if (iVar5 != 0) {
          return 1;
        }
        if (Fl::e_keysym != 0xff09) {
          return 1;
        }
        pmVar2->item_number = -1;
        iVar5 = pmVar2->menu_number;
      }
LAB_001afa31:
      forward(iVar5);
      return 1;
    }
    if ((Fl::e_keysym != 0x20) && (Fl::e_keysym != 0xff8d)) {
      if (Fl::e_keysym == 0xff09) {
        if ((Fl::e_state._2_1_ & 1) != 0) {
LAB_001af925:
          iVar5 = backward(::p->menu_number);
          if (iVar5 == 0) {
            pmVar2->item_number = -1;
            backward(pmVar2->menu_number);
            return 1;
          }
          return 1;
        }
        goto switchD_001af891_caseD_ff54;
      }
      if (Fl::e_keysym != 0xff0d) {
        if (Fl::e_keysym != 0xff1b) {
          if (Fl::e_keysym != 0xff08) goto switchD_001af617_caseD_4;
          goto LAB_001af925;
        }
        ::p->current_item = (Fl_Menu_Item *)0x0;
        pmVar2->menu_number = -1;
        pmVar2->item_number = 0;
      }
    }
    goto LAB_001af993;
  case 0xb:
    if (::p->state == 2) {
      return 1;
    }
switchD_001af617_caseD_1:
    if ((::p->menubar == 0) || (::p->nummenus != 1)) {
      iVar4 = menustate::is_inside(::p,Fl::e_x_root,Fl::e_y_root);
      pmVar3 = ::p;
      if (iVar4 == 0) {
        ::p->current_item = (Fl_Menu_Item *)0x0;
        pmVar3->menu_number = -1;
        pmVar3->item_number = 0;
        if (e == 1) {
          pmVar2->state = 2;
          return 1;
        }
        return 1;
      }
      lVar7 = (long)pmVar2->nummenus;
    }
    else {
      lVar7 = 1;
    }
    lVar7 = lVar7 + 1;
    do {
      iVar4 = find_selected(pmVar2->p[lVar7 + -2],iVar5,my);
      if (-1 < iVar4) {
        setitem((int)lVar7 + -2,iVar4 - (uint)(iVar4 != 0 && my == 0));
        if (e != 1) {
          return 1;
        }
        pFVar6 = pmVar2->current_item;
        if ((((pFVar6 != (Fl_Menu_Item *)0x0) && ((pFVar6->flags & 0x60) != 0)) &&
            (iVar4 != pmVar2->p[lVar7 + -2]->selected)) && (pFVar6->callback_ == (Fl_Callback *)0x0)
           ) {
          pmVar2->state = 3;
          return 1;
        }
        pmVar2->state = 1;
        return 1;
      }
      lVar7 = lVar7 + -1;
    } while (1 < lVar7);
    if (e == 1 && pmVar2->menu_number == -1) {
LAB_001af993:
      pmVar2->state = 2;
    }
    else {
      if (pmVar2->menu_number != 0 || pmVar2->current_item == (Fl_Menu_Item *)0x0) {
        return 0;
      }
      if ((pmVar2->current_item->flags & 0x60) != 0) {
        return 0;
      }
      if (e == 1) {
        pmVar2->state = 2;
      }
      pmVar2 = ::p;
      ::p->current_item = (Fl_Menu_Item *)0x0;
      pmVar2->menu_number = -1;
      pmVar2->item_number = 0;
    }
    return 1;
  case 0xc:
    iVar5 = ::p->nummenus;
    lVar7 = (long)iVar5;
    uStack_38 = in_RAX;
    do {
      iVar5 = iVar5 + -1;
      if (lVar7 == 0) goto switchD_001af617_caseD_4;
      pFVar6 = Fl_Menu_Item::find_shortcut(pmVar2->p[lVar7 + -1]->menu,&item,false);
      pmVar3 = ::p;
      lVar7 = lVar7 + -1;
    } while (pFVar6 == (Fl_Menu_Item *)0x0);
    ::p->current_item = pFVar6;
    pmVar3->menu_number = iVar5;
    pmVar3->item_number = item;
    bVar1 = (byte)pFVar6->flags & 0x60;
joined_r0x001af878:
    if (bVar1 != 0) {
      return 1;
    }
    goto LAB_001af993;
  }
}

Assistant:

int menuwindow::early_hide_handle(int e) {
#endif
  menustate &pp = *p;
  switch (e) {
  case FL_KEYBOARD:
    switch (Fl::event_key()) {
    case FL_BackSpace:
    BACKTAB:
      if (!backward(pp.menu_number)) {pp.item_number = -1;backward(pp.menu_number);}
      return 1;
    case FL_Up:
      if (pp.menubar && pp.menu_number == 0) {
        // Do nothing...
      } else if (backward(pp.menu_number)) {
        // Do nothing...
      } else if (pp.menubar && pp.menu_number==1) {
        setitem(0, pp.p[0]->selected);
      }
      return 1;
    case FL_Tab:
      if (Fl::event_shift()) goto BACKTAB;
    case FL_Down:
      if (pp.menu_number || !pp.menubar) {
        if (!forward(pp.menu_number) && Fl::event_key()==FL_Tab) {
          pp.item_number = -1;
          forward(pp.menu_number);
        }
      } else if (pp.menu_number < pp.nummenus-1) {
        forward(pp.menu_number+1);
      }
      return 1;
    case FL_Right:
      if (pp.menubar && (pp.menu_number<=0 || (pp.menu_number==1 && pp.nummenus==2)))
	forward(0);
      else if (pp.menu_number < pp.nummenus-1) forward(pp.menu_number+1);
      return 1;
    case FL_Left:
      if (pp.menubar && pp.menu_number<=1) backward(0);
      else if (pp.menu_number>0)
	setitem(pp.menu_number-1, pp.p[pp.menu_number-1]->selected);
      return 1;
    case FL_Enter:
    case FL_KP_Enter:
    case ' ':
      pp.state = DONE_STATE;
      return 1;
    case FL_Escape:
      setitem(0, -1, 0);
      pp.state = DONE_STATE;
      return 1;
    }
    break;
  case FL_SHORTCUT: 
    {
      for (int mymenu = pp.nummenus; mymenu--;) {
	menuwindow &mw = *(pp.p[mymenu]);
	int item; const Fl_Menu_Item* m = mw.menu->find_shortcut(&item);
	if (m) {
	  setitem(m, mymenu, item);
	  if (!m->submenu()) pp.state = DONE_STATE;
	  return 1;
	}
      }
    }
    break;
    case FL_MOVE:
#if ! (defined(WIN32) || defined(__APPLE__))
      if (pp.state == DONE_STATE) {
	return 1; // Fix for STR #2619
      }
      /* FALLTHROUGH */
#endif
  case FL_ENTER:
  case FL_PUSH:
  case FL_DRAG:
    {
      int mx = Fl::event_x_root();
      int my = Fl::event_y_root();
      int item=0; int mymenu = pp.nummenus-1;
      // Clicking or dragging outside menu cancels it...
      if ((!pp.menubar || mymenu) && !pp.is_inside(mx, my)) {
	setitem(0, -1, 0);
	if (e==FL_PUSH)
	  pp.state = DONE_STATE;
	return 1;
      }
      for (mymenu = pp.nummenus-1; ; mymenu--) {
	item = pp.p[mymenu]->find_selected(mx, my);
	if (item >= 0) 
	  break;
	if (mymenu <= 0) {
	  // buttons in menubars must be deselected if we move outside of them!
	  if (pp.menu_number==-1 && e==FL_PUSH) {
	    pp.state = DONE_STATE;
	    return 1;
	  }
	  if (pp.current_item && pp.menu_number==0 && !pp.current_item->submenu()) {
	    if (e==FL_PUSH)
	      pp.state = DONE_STATE;
	    setitem(0, -1, 0);
	    return 1;
	  }
	  // all others can stay selected
	  return 0;
	}
      }
      if (my == 0 && item > 0) setitem(mymenu, item - 1);
      else setitem(mymenu, item);
      if (e == FL_PUSH) {
	if (pp.current_item && pp.current_item->submenu() // this is a menu title
	    && item != pp.p[mymenu]->selected // and it is not already on
	    && !pp.current_item->callback_) // and it does not have a callback
	  pp.state = MENU_PUSH_STATE;
	else
	  pp.state = PUSH_STATE;
      }
    }
    return 1;
  case FL_RELEASE:
    // Mouse must either be held down/dragged some, or this must be
    // the second click (not the one that popped up the menu):
    if (   !Fl::event_is_click() 
        || pp.state == PUSH_STATE 
        || (pp.menubar && pp.current_item && !pp.current_item->submenu()) // button
	) {
#if 0 // makes the check/radio items leave the menu up
      const Fl_Menu_Item* m = pp.current_item;
      if (m && button && (m->flags & (FL_MENU_TOGGLE|FL_MENU_RADIO))) {
	((Fl_Menu_*)button)->picked(m);
	pp.p[pp.menu_number]->redraw();
      } else
#endif
      // do nothing if they try to pick inactive items
      if (!pp.current_item || pp.current_item->activevisible())
	pp.state = DONE_STATE;
    }
    return 1;
  }
  return Fl_Window::handle(e);
}